

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_define_array.hpp
# Opt level: O2

void msgpack::v1::type::
     define_array_imp<std::tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>,_3UL>
     ::unpack(object *o,
             tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>
             *t)

{
  define_array_imp<std::tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>,_2UL>
  ::unpack(o,t);
  if ((o->super_object).via.array.size < 3) {
    return;
  }
  object::convert<int>
            (&(o->super_object).via.array.ptr[2].super_object,
             (t->
             super__Tuple_impl<0UL,_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>
             ).
             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>
             .super__Tuple_impl<2UL,_int_&>.super__Head_base<2UL,_int_&,_false>._M_head_impl);
  return;
}

Assistant:

static void unpack(msgpack::object const& o, Tuple& t) {
        define_array_imp<Tuple, N-1>::unpack(o, t);
        const size_t size = o.via.array.size;
        if(size <= N-1) { return; }
        convert_helper(o.via.array.ptr[N-1], std::get<N-1>(t));
    }